

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O2

int appenddata(char **dst_buf,size_t *dst_len,size_t *dst_alloc,char *src_buf,int src_b64)

{
  CURLcode CVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  anon_union_8_2_5fd17a9a buf64;
  size_t src_len;
  
  src_len = strlen(src_buf);
  if (src_len == 0) {
    return 0;
  }
  buf64.as_uchar = (uchar *)0x0;
  if (src_b64 == 0) {
LAB_0010401c:
    sVar4 = *dst_len;
    uVar5 = src_len + sVar4 + 1;
    pcVar2 = *dst_buf;
    if (*dst_alloc < uVar5) {
      sVar4 = uVar5 * 2;
      pcVar2 = (char *)(*Curl_crealloc)(pcVar2,sVar4);
      if (pcVar2 != (char *)0x0) {
        *dst_alloc = sVar4;
        *dst_buf = pcVar2;
        sVar4 = *dst_len;
        goto LAB_00104055;
      }
      iVar3 = -1;
    }
    else {
LAB_00104055:
      memcpy(pcVar2 + sVar4,src_buf,src_len);
      sVar4 = *dst_len;
      *dst_len = sVar4 + src_len;
      (*dst_buf)[sVar4 + src_len] = '\0';
      iVar3 = 0;
    }
    if (buf64.as_uchar == (uchar *)0x0) {
      return iVar3;
    }
LAB_00104086:
    (*Curl_cfree)(buf64.as_uchar);
  }
  else {
    CVar1 = Curl_base64_decode(src_buf,&buf64.as_uchar,&src_len);
    if (CVar1 == CURLE_OK) {
      if (buf64.as_uchar != (uchar *)0x0 && src_len == 0) {
        iVar3 = -1;
        goto LAB_00104086;
      }
      src_buf = buf64.as_char;
      if (src_len != 0 && buf64.as_uchar != (uchar *)0x0) goto LAB_0010401c;
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int appenddata(char  **dst_buf,   /* dest buffer */
                      size_t *dst_len,   /* dest buffer data length */
                      size_t *dst_alloc, /* dest buffer allocated size */
                      char   *src_buf,   /* source buffer */
                      int     src_b64)   /* != 0 if source is base64 encoded */
{
  size_t need_alloc, src_len;
  union {
    unsigned char *as_uchar;
             char *as_char;
  } buf64;

  src_len = strlen(src_buf);
  if(!src_len)
    return GPE_OK;

  buf64.as_char = NULL;

  if(src_b64) {
    /* base64 decode the given buffer */
    int error = (int) Curl_base64_decode(src_buf, &buf64.as_uchar, &src_len);
    if(error)
      return GPE_OUT_OF_MEMORY;
    src_buf = buf64.as_char;
    if(!src_len || !src_buf) {
      /*
      ** currently there is no way to tell apart an OOM condition in
      ** Curl_base64_decode() from zero length decoded data. For now,
      ** let's just assume it is an OOM condition, currently we have
      ** no input for this function that decodes to zero length data.
      */
      if(buf64.as_char)
        free(buf64.as_char);
      return GPE_OUT_OF_MEMORY;
    }
  }

  need_alloc = src_len + *dst_len + 1;

  /* enlarge destination buffer if required */
  if(need_alloc > *dst_alloc) {
    size_t newsize = need_alloc * 2;
    char *newptr = realloc(*dst_buf, newsize);
    if(!newptr) {
      if(buf64.as_char)
        free(buf64.as_char);
      return GPE_OUT_OF_MEMORY;
    }
    *dst_alloc = newsize;
    *dst_buf = newptr;
  }

  /* memcpy to support binary blobs */
  memcpy(*dst_buf + *dst_len, src_buf, src_len);
  *dst_len += src_len;
  *(*dst_buf + *dst_len) = '\0';

  if(buf64.as_char)
    free(buf64.as_char);

  return GPE_OK;
}